

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

char * __thiscall Catch::Matchers::Impl::StdString::EndsWith::toString_abi_cxx11_(EndsWith *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  char *in_RDI;
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30 [32];
  
  __lhs = local_30;
  __rhs = in_RDI;
  std::operator+(in_RDI,in_RSI);
  std::operator+(__lhs,__rhs);
  std::__cxx11::string::~string((string *)local_30);
  return in_RDI;
}

Assistant:

virtual std::string toString() const {
                return "ends with: \"" + m_substr + "\"";
            }